

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PokerCardGameDDZUtils.cpp
# Opt level: O3

map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_> *
create_poker_number_map(void)

{
  _Rb_tree_header *p_Var1;
  uint in_EAX;
  mapped_type *pmVar2;
  map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
  *in_RDI;
  undefined8 uStack_18;
  
  p_Var1 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_18 = (ulong)in_EAX;
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 0xd;
  uStack_18 = CONCAT44(2,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 0xc;
  uStack_18 = CONCAT44(1,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 0xb;
  uStack_18 = CONCAT44(0xd,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 10;
  uStack_18 = CONCAT44(0xc,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 9;
  uStack_18 = CONCAT44(0xb,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 8;
  uStack_18 = CONCAT44(10,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 7;
  uStack_18 = CONCAT44(9,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 6;
  uStack_18 = CONCAT44(8,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 5;
  uStack_18 = CONCAT44(7,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 4;
  uStack_18 = CONCAT44(6,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 3;
  uStack_18 = CONCAT44(5,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 2;
  uStack_18 = CONCAT44(4,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 1;
  uStack_18 = CONCAT44(3,(undefined4)uStack_18);
  pmVar2 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,(key_type *)((long)&uStack_18 + 4));
  *pmVar2 = 0;
  return in_RDI;
}

Assistant:

std::map<PokerNumber,int> create_poker_number_map()
{
        std::map<PokerNumber,int> m;
        m[JOKER]  = 13;
        m[_2]     = 12;
        m[A]      = 11;
        m[K]      = 10;
        m[Q]      = 9;
        m[J]      = 8;
        m[_10]    = 7;
        m[_9]     = 6;
        m[_8]     = 5;
        m[_7]     = 4;
        m[_6]     = 3;
        m[_5]     = 2;
        m[_4]     = 1;
        m[_3]     = 0;
        return m;
}